

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3LookasideUsed(sqlite3 *db,int *pHighwater)

{
  int iVar1;
  int iVar2;
  LookasideSlot *pLVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = 0;
  for (pLVar3 = (db->lookaside).pInit; pLVar3 != (LookasideSlot *)0x0; pLVar3 = pLVar3->pNext) {
    iVar1 = iVar1 + 1;
  }
  iVar2 = -1;
  for (pLVar3 = (db->lookaside).pFree; pLVar3 != (LookasideSlot *)0x0; pLVar3 = pLVar3->pNext) {
    iVar2 = iVar2 + 1;
  }
  iVar4 = 0;
  for (pLVar3 = (db->lookaside).pSmallInit; pLVar3 != (LookasideSlot *)0x0; pLVar3 = pLVar3->pNext)
  {
    iVar4 = iVar4 + 1;
  }
  iVar5 = -1;
  for (pLVar3 = (db->lookaside).pSmallFree; pLVar3 != (LookasideSlot *)0x0; pLVar3 = pLVar3->pNext)
  {
    iVar5 = iVar5 + 1;
  }
  if (pHighwater != (int *)0x0) {
    *pHighwater = (db->lookaside).nSlot - (iVar4 + iVar1);
  }
  return ((db->lookaside).nSlot - (iVar2 + iVar4 + iVar1 + iVar5)) + -2;
}

Assistant:

SQLITE_PRIVATE int sqlite3LookasideUsed(sqlite3 *db, int *pHighwater){
  u32 nInit = countLookasideSlots(db->lookaside.pInit);
  u32 nFree = countLookasideSlots(db->lookaside.pFree);
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
  nInit += countLookasideSlots(db->lookaside.pSmallInit);
  nFree += countLookasideSlots(db->lookaside.pSmallFree);
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
  if( pHighwater ) *pHighwater = db->lookaside.nSlot - nInit;
  return db->lookaside.nSlot - (nInit+nFree);
}